

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_> *
Jinx::Impl::GetUtf8CharByIndex
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
           *__return_storage_ptr__,String *source,int64_t index)

{
  char *utf8Str;
  ulong local_58;
  size_t i;
  String out;
  size_t charCount;
  char *srcCurr;
  int64_t index_local;
  String *source_local;
  
  utf8Str = GetUtf8CstrByIndex(source,index);
  if (utf8Str == (char *)0x0) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  else {
    out.field_2._8_8_ = GetUtf8CharSize(utf8Str);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i);
    for (local_58 = 0; local_58 < (ulong)out.field_2._8_8_; local_58 = local_58 + 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i,
                 utf8Str[local_58]);
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&i);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t std::optional<String> GetUtf8CharByIndex(const String & source, int64_t index)
	{
		const char * srcCurr = GetUtf8CstrByIndex(source, index);
		if (srcCurr == nullptr)
			return std::optional<String>();
		size_t charCount = GetUtf8CharSize(srcCurr);
		String out;
		for (size_t i = 0; i < charCount; ++i)
			out += srcCurr[i];
		return out;
	}